

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall sptk::swipe::printm(swipe *this,matrix yr_matrix)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar4 = (ulong)this >> 0x20;
  if ((int)((ulong)this >> 0x20) == 0 || (long)this < 0) {
    uVar4 = uVar2;
  }
  uVar3 = 0;
  if (0 < (int)this) {
    uVar3 = (ulong)this & 0xffffffff;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
      printf("%f\t",*(undefined8 *)(*(long *)(yr_matrix._0_8_ + uVar2 * 8) + uVar1 * 8));
    }
    putchar(10);
  }
  return;
}

Assistant:

void printm(matrix yr_matrix) {
    int i, j;
    for (i = 0; i < yr_matrix.x; i++) {
        for (j = 0; j < yr_matrix.y; j++)
            printf("%f\t", yr_matrix.m[i][j]);
        printf("\n");
    }
}